

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O1

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  string *name;
  XmlWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XmlWriter *pXVar2;
  OfType OVar3;
  pointer pMVar4;
  pointer pcVar5;
  _Alloc_hider this_01;
  int iVar6;
  byte bVar7;
  XmlFormatting fmt;
  pointer pMVar8;
  AssertionStats *pAVar9;
  string local_b0;
  AssertionStats *local_90;
  undefined1 local_88 [32];
  string local_68;
  _Alloc_hider local_48;
  StringRef local_40;
  
  local_48._M_p = (pointer)this;
  iVar6 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  bVar7 = 1;
  if ((char)iVar6 == '\0') {
    bVar7 = ((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0 &
            (byte)(char)(assertionStats->assertionResult).m_resultData.resultType >> 4;
  }
  local_90 = assertionStats;
  if ((bVar7 != 0) || ((assertionStats->assertionResult).m_resultData.resultType == Warning)) {
    pMVar8 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar4 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar8 != pMVar4) {
      name = (string *)(local_48._M_p + 0x170);
      do {
        fmt = (XmlFormatting)&local_b0;
        if (pMVar8->type == Info && bVar7 == 1) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Info","");
          XmlWriter::scopedElement((XmlWriter *)local_88,name,fmt);
          XmlWriter::writeText((XmlWriter *)local_88._0_8_,&pMVar8->message,Newline|Indent);
LAB_00132357:
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
        }
        else if (pMVar8->type == Warning) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Warning","");
          XmlWriter::scopedElement((XmlWriter *)local_88,name,fmt);
          XmlWriter::writeText((XmlWriter *)local_88._0_8_,&pMVar8->message,Newline|Indent);
          goto LAB_00132357;
        }
        pMVar8 = pMVar8 + 1;
      } while (pMVar8 != pMVar4);
    }
  }
  this_01._M_p = local_48._M_p;
  pAVar9 = local_90;
  if ((bVar7 | (local_90->assertionResult).m_resultData.resultType == Warning) != 1) {
    return true;
  }
  if ((local_90->assertionResult).m_info.capturedExpression.m_size != 0) {
    paVar1 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Expression","");
    this_00 = (XmlWriter *)(this_01._M_p + 0x170);
    XmlWriter::startElement(this_00,&local_b0,Newline|Indent);
    pXVar2 = (XmlWriter *)(local_88 + 0x10);
    local_88._0_8_ = pXVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"success","");
    XmlWriter::writeAttribute
              (this_00,(string *)local_88,
               ((pAVar9->assertionResult).m_resultData.resultType & FailureBit) == Ok);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"type","");
    local_40.m_start = (local_90->assertionResult).m_info.macroName.m_start;
    local_40.m_size = (local_90->assertionResult).m_info.macroName.m_size;
    XmlWriter::writeAttribute<Catch::StringRef>(this_00,&local_68,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    pAVar9 = local_90;
    if ((XmlWriter *)local_88._0_8_ != pXVar2) {
      operator_delete((void *)local_88._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pAVar9->assertionResult).m_info.lineInfo.file;
    local_b0._M_string_length = (pAVar9->assertionResult).m_info.lineInfo.line;
    writeSourceInfo((XmlReporter *)this_01._M_p,(SourceLineInfo *)&local_b0);
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Original","");
    XmlWriter::scopedElement((XmlWriter *)&local_68,(string *)this_00,(XmlFormatting)&local_b0);
    AssertionResult::getExpression_abi_cxx11_((string *)local_88,&pAVar9->assertionResult);
    XmlWriter::writeText((XmlWriter *)local_68._M_dataplus._M_p,(string *)local_88,Newline|Indent);
    if ((XmlWriter *)local_88._0_8_ != pXVar2) {
      operator_delete((void *)local_88._0_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Expanded","");
    XmlWriter::scopedElement((XmlWriter *)&local_68,(string *)this_00,(XmlFormatting)&local_b0);
    AssertionResult::getExpandedExpression_abi_cxx11_((string *)local_88,&pAVar9->assertionResult);
    XmlWriter::writeText((XmlWriter *)local_68._M_dataplus._M_p,(string *)local_88,Newline|Indent);
    if ((XmlWriter *)local_88._0_8_ != pXVar2) {
      operator_delete((void *)local_88._0_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  OVar3 = (pAVar9->assertionResult).m_resultData.resultType;
  if (OVar3 < ThrewException) {
    if (OVar3 == Info) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Info","");
      XmlWriter::scopedElement
                ((XmlWriter *)&local_68,(string *)(this_01._M_p + 0x170),(XmlFormatting)&local_b0);
      pcVar5 = (local_90->assertionResult).m_resultData.message._M_dataplus._M_p;
      local_88._0_8_ = (XmlWriter *)(local_88 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,pcVar5,
                 pcVar5 + (local_90->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_68._M_dataplus._M_p,(string *)local_88,Newline|Indent)
      ;
      if ((XmlWriter *)local_88._0_8_ != (XmlWriter *)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_68);
      pAVar9 = local_90;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
        pAVar9 = local_90;
      }
      goto LAB_00132870;
    }
    if (OVar3 != ExplicitFailure) goto LAB_00132870;
    paVar1 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Failure","");
    XmlWriter::startElement((XmlWriter *)(this_01._M_p + 0x170),&local_b0,Newline|Indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pAVar9 = local_90;
    local_b0._M_dataplus._M_p = (local_90->assertionResult).m_info.lineInfo.file;
    local_b0._M_string_length = (local_90->assertionResult).m_info.lineInfo.line;
    writeSourceInfo((XmlReporter *)this_01._M_p,(SourceLineInfo *)&local_b0);
    pcVar5 = (pAVar9->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar5,
               pcVar5 + (pAVar9->assertionResult).m_resultData.message._M_string_length);
    XmlWriter::writeText((XmlWriter *)(this_01._M_p + 0x170),&local_b0,Newline|Indent);
  }
  else if (OVar3 == FatalErrorCondition) {
    paVar1 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"FatalErrorCondition","");
    XmlWriter::startElement((XmlWriter *)(this_01._M_p + 0x170),&local_b0,Newline|Indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pAVar9 = local_90;
    local_b0._M_dataplus._M_p = (local_90->assertionResult).m_info.lineInfo.file;
    local_b0._M_string_length = (local_90->assertionResult).m_info.lineInfo.line;
    writeSourceInfo((XmlReporter *)this_01._M_p,(SourceLineInfo *)&local_b0);
    pcVar5 = (pAVar9->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar5,
               pcVar5 + (pAVar9->assertionResult).m_resultData.message._M_string_length);
    XmlWriter::writeText((XmlWriter *)(this_01._M_p + 0x170),&local_b0,Newline|Indent);
  }
  else {
    if (OVar3 != ThrewException) goto LAB_00132870;
    paVar1 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Exception","");
    XmlWriter::startElement((XmlWriter *)(this_01._M_p + 0x170),&local_b0,Newline|Indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pAVar9 = local_90;
    local_b0._M_dataplus._M_p = (local_90->assertionResult).m_info.lineInfo.file;
    local_b0._M_string_length = (local_90->assertionResult).m_info.lineInfo.line;
    writeSourceInfo((XmlReporter *)this_01._M_p,(SourceLineInfo *)&local_b0);
    pcVar5 = (pAVar9->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar5,
               pcVar5 + (pAVar9->assertionResult).m_resultData.message._M_string_length);
    XmlWriter::writeText((XmlWriter *)(this_01._M_p + 0x170),&local_b0,Newline|Indent);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  XmlWriter::endElement((XmlWriter *)(this_01._M_p + 0x170),Newline|Indent);
  pAVar9 = local_90;
LAB_00132870:
  if ((pAVar9->assertionResult).m_info.capturedExpression.m_size != 0) {
    XmlWriter::endElement((XmlWriter *)(this_01._M_p + 0x170),Newline|Indent);
  }
  return true;
}

Assistant:

bool XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    m_xml.scopedElement( "Info" )
                            .writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    m_xml.scopedElement( "Warning" )
                            .writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if( !includeResults && result.getResultType() != ResultWas::Warning )
            return true;

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success", result.succeeded() )
                .writeAttribute( "type", result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                    .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();

        return true;
    }